

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O2

int __thiscall
raptor::TcpServer::GetPeerString(TcpServer *this,ConnectionId cid,char *buf,int buf_len)

{
  uint32_t uVar1;
  int iVar2;
  shared_ptr<raptor::Connection> con;
  
  uVar1 = CheckConnectionId(this,cid);
  if (uVar1 == 0xffffffff) {
    iVar2 = -1;
  }
  else {
    GetConnection((TcpServer *)&con,(uint32_t)this);
    if (con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar2 = -1;
    }
    else {
      iVar2 = Connection::GetPeerString
                        (con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,buf,buf_len);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return iVar2;
}

Assistant:

int TcpServer::GetPeerString(ConnectionId cid, char* buf, int buf_len) {
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return -1;
    }

    auto con = GetConnection(index);
    if (con) {
        return con->GetPeerString(buf, buf_len);
    }
    return -1;
}